

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::BinaryExpression>
          (ConstraintExprVisitor *this,BinaryExpression *expr)

{
  ExpressionKind EVar1;
  BinaryOperator BVar2;
  int iVar3;
  Expression *this_00;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  RandMode RVar10;
  SubroutineKind SVar11;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar12;
  SourceLocation SVar13;
  long lVar15;
  DiagCode code;
  ASTContext *this_01;
  BinaryExpression *binExpr;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  byte local_2b;
  SourceLocation SVar14;
  
  if ((this->failed != false) || (bVar8 = Expression::bad(&expr->super_Expression), bVar8))
  goto LAB_00863173;
  symbol = Expression::getSymbolReference(&expr->super_Expression,true);
  if (symbol != (Symbol *)0x0) {
    RVar10 = ASTContext::getRandMode(this->context,symbol);
    if (RVar10 != None) {
      this->sawRandVars = true;
    }
    if ((RVar10 == RandC) && (this->isSoft != false)) {
      ASTContext::addDiag(this->context,(DiagCode)0x390008,(expr->super_Expression).sourceRange);
    }
  }
  EVar1 = (expr->super_Expression).kind;
  if ((EVar1 < Conversion) && ((0x340000U >> (EVar1 & ValueRange) & 1) != 0)) {
    cVar9 = '\0';
  }
  else {
    bVar8 = this->isTop;
    bVar7 = this->sawRandVars;
    this->isTop = false;
    this->sawRandVars = false;
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
              (expr->left_,expr->left_,this);
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
              (expr->right_,expr->right_,this);
    cVar9 = this->sawRandVars;
    this->isTop = bVar8;
    this->sawRandVars = bVar7;
  }
  EVar1 = (expr->super_Expression).kind;
  switch(EVar1) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_38,(SVIntStorage *)&expr->right_);
    goto LAB_00863035;
  case RealLiteral:
  case TimeLiteral:
    this_01 = this->context;
    if (0 < (int)(((this_01->scope).ptr)->compilation->options).languageVersion) break;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar13 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2f;
    goto LAB_00862f72;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_38);
LAB_00863035:
    if ((0x40 < local_30 || (local_2b & 1) != 0) && ((void *)local_38.val != (void *)0x0)) {
      operator_delete__(local_38.pVal);
    }
    if ((local_2b & 1) == 0) {
      return true;
    }
    this_01 = this->context;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar13 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x50;
    goto LAB_00862f72;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case UnaryOp:
  case ConditionalOp:
  case Inside:
  case Assignment:
  case Concatenation:
  case Replication:
  case ElementSelect:
  case RangeSelect:
  case MemberAccess:
    break;
  case NamedValue:
  case HierarchicalValue:
    if (this->isTop == false) {
      return true;
    }
    break;
  case BinaryOp:
    BVar2 = expr->op;
    if (BVar2 < LogicalShiftLeft) {
      if ((0x79e600U >> (BVar2 & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
        if ((0x61800U >> (BVar2 & (LogicalShiftRight|BinaryXor)) & 1) != 0)
        goto switchD_00862f22_caseD_11;
      }
      else if ((cVar9 != '\0') &&
              ((((expr->left_->kind & ~IntegerLiteral) == NamedValue &&
                (bVar8 = checkType(this,expr->left_), !bVar8)) ||
               (((expr->right_->kind & ~IntegerLiteral) == NamedValue &&
                (bVar8 = checkType(this,expr->right_), !bVar8)))))) goto LAB_00863173;
    }
    break;
  case Streaming:
switchD_00862f22_caseD_11:
    this_01 = this->context;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar13 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x18;
LAB_00862f72:
    sourceRange.endLoc = SVar13;
    sourceRange.startLoc = SVar14;
    ASTContext::addDiag(this_01,code,sourceRange);
    goto LAB_00863173;
  case Call:
    SVar11 = CallExpression::getSubroutineKind((CallExpression *)expr);
    if (SVar11 == Task) {
      this_01 = this->context;
      SVar14 = (expr->super_Expression).sourceRange.startLoc;
      SVar13 = (expr->super_Expression).sourceRange.endLoc;
      code.subsystem = Statements;
      code.code = 0x4b;
      goto LAB_00862f72;
    }
    if (*(char *)&expr[1].super_Expression.type.ptr != '\x01') {
      ppSVar12 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)&expr->left_);
      pSVar4 = *ppSVar12;
      if ((pSVar4->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar4->super_Scope);
      }
      sVar5 = (pSVar4->arguments)._M_extent._M_extent_value;
      bVar8 = sVar5 == 0;
      if (!bVar8) {
        lVar15 = 0;
        bVar8 = false;
        do {
          lVar6 = *(long *)((long)(pSVar4->arguments)._M_ptr + lVar15);
          iVar3 = *(int *)(lVar6 + 0x158);
          if (iVar3 == 3) {
            if ((*(byte *)(lVar6 + 0x154) & 1) == 0) goto LAB_00863145;
          }
          else if (iVar3 - 1U < 2) {
LAB_00863145:
            ASTContext::addDiag(this->context,(DiagCode)0x320008,
                                (expr->super_Expression).sourceRange);
            this->failed = true;
            break;
          }
          lVar15 = lVar15 + 8;
          bVar8 = sVar5 << 3 == lVar15;
        } while (!bVar8);
      }
      if (!bVar8) {
        return false;
      }
    }
    break;
  default:
    switch(EVar1) {
    case ValueRange:
      return true;
    case Dist:
      local_38 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_30 = local_30 & 0xffffff00;
      this_00 = expr->left_;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                (this_00,this_00,(DistVarVisitor *)&local_38);
      if ((char)local_30 == '\0') {
        ASTContext::addDiag(this->context,(DiagCode)0x3c0008,this_00->sourceRange);
        return true;
      }
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_00862f22_caseD_11;
    }
  }
  bVar8 = checkType(this,&expr->super_Expression);
  if (bVar8) {
    return true;
  }
LAB_00863173:
  this->failed = true;
  return false;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }